

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Point32>::quickSortInternal<pointCmp>
          (btAlignedObjectArray<btConvexHullInternal::Point32> *this,pointCmp *CompareFunc,int lo,
          int hi)

{
  bool bVar1;
  Point32 *pPVar2;
  int in_ECX;
  int in_EDX;
  btAlignedObjectArray<btConvexHullInternal::Point32> *in_RSI;
  btAlignedObjectArray<btConvexHullInternal::Point32> *in_RDI;
  Point32 x;
  int j;
  int i;
  Point32 local_30;
  int iVar3;
  int iVar4;
  
  pPVar2 = in_RDI->m_data + (in_EDX + in_ECX) / 2;
  local_30.x = pPVar2->x;
  local_30.y = pPVar2->y;
  local_30.z = pPVar2->z;
  local_30.index = pPVar2->index;
  iVar3 = in_ECX;
  iVar4 = in_EDX;
  do {
    while (bVar1 = pointCmp::operator()((pointCmp *)in_RSI,in_RDI->m_data + in_EDX,&local_30), bVar1
          ) {
      in_EDX = in_EDX + 1;
    }
    while (bVar1 = pointCmp::operator()((pointCmp *)in_RSI,&local_30,in_RDI->m_data + in_ECX), bVar1
          ) {
      in_ECX = in_ECX + -1;
    }
    if (in_EDX <= in_ECX) {
      swap(in_RDI,in_EDX,in_ECX);
      in_EDX = in_EDX + 1;
      in_ECX = in_ECX + -1;
    }
  } while (in_EDX <= in_ECX);
  if (iVar4 < in_ECX) {
    quickSortInternal<pointCmp>(in_RSI,(pointCmp *)CONCAT44(iVar4,iVar3),in_EDX,in_ECX);
  }
  if (in_EDX < iVar3) {
    quickSortInternal<pointCmp>(in_RSI,(pointCmp *)CONCAT44(iVar4,iVar3),in_EDX,in_ECX);
  }
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}